

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O2

void av1_cfl_predict_block(MACROBLOCKD *xd,uint8_t *dst,int dst_stride,TX_SIZE tx_size,int plane)

{
  CFL_CTX *pCVar1;
  byte bVar2;
  uint16_t uVar3;
  int iVar4;
  int iVar5;
  MB_MODE_INFO *pMVar6;
  uint uVar7;
  cfl_subtract_average_fn p_Var8;
  cfl_predict_lbd_fn UNRECOVERED_JUMPTABLE_00;
  cfl_predict_hbd_fn UNRECOVERED_JUMPTABLE;
  int iVar9;
  ulong uVar10;
  uint16_t *puVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  
  pMVar6 = *xd->mi;
  if ((xd->cfl).are_parameters_computed == 0) {
    pCVar1 = &xd->cfl;
    uVar17 = *(uint *)((long)tx_size_wide + (ulong)((uint)tx_size * 4));
    iVar9 = *(int *)((long)tx_size_high + (ulong)((uint)tx_size * 4));
    iVar4 = (xd->cfl).buf_width;
    iVar5 = (xd->cfl).buf_height;
    iVar12 = iVar9 - iVar5;
    if (uVar17 - iVar4 != 0 && iVar4 <= (int)uVar17) {
      puVar11 = pCVar1->recon_buf_q3 + iVar4;
      iVar14 = 0;
      iVar16 = 0;
      if (0 < iVar5) {
        iVar16 = iVar5;
      }
      for (; iVar14 != iVar16; iVar14 = iVar14 + 1) {
        uVar3 = puVar11[-1];
        for (uVar10 = 0; uVar17 - iVar4 != uVar10; uVar10 = uVar10 + 1) {
          puVar11[uVar10] = uVar3;
        }
        puVar11 = puVar11 + 0x20;
      }
      (xd->cfl).buf_width = uVar17;
    }
    if (0 < iVar12) {
      puVar11 = pCVar1->recon_buf_q3 + (long)iVar5 * 0x20;
      uVar13 = 0;
      uVar10 = (ulong)uVar17;
      if ((int)uVar17 < 1) {
        uVar10 = uVar13;
      }
      for (; (int)uVar13 != iVar12; uVar13 = (ulong)((int)uVar13 + 1)) {
        for (uVar15 = 0; uVar10 != uVar15; uVar15 = uVar15 + 1) {
          puVar11[uVar15] = puVar11[uVar15 - 0x20];
        }
        puVar11 = puVar11 + 0x20;
      }
      (xd->cfl).buf_height = iVar9;
    }
    p_Var8 = (*cfl_get_subtract_average_fn)(tx_size);
    (*p_Var8)(pCVar1->recon_buf_q3,(xd->cfl).ac_buf_q3);
    (xd->cfl).are_parameters_computed = 1;
  }
  iVar9 = (int)pMVar6->cfl_alpha_signs;
  if ((plane & 0xffU) == 1) {
    iVar9 = iVar9 * 0xb + 0xb >> 5;
  }
  else {
    iVar9 = iVar9 + ((iVar9 + 1) * 0xb >> 5) * -3 + 1;
  }
  if (iVar9 == 0) {
    uVar17 = 0;
  }
  else {
    bVar2 = pMVar6->cfl_alpha_idx;
    uVar7 = bVar2 & 0xf;
    if ((plane & 0xffU) == 1) {
      uVar7 = (uint)(bVar2 >> 4);
    }
    uVar17 = ~uVar7;
    if (iVar9 == 2) {
      uVar17 = uVar7 + 1;
    }
  }
  if ((xd->cur_buf->flags & 8) != 0) {
    UNRECOVERED_JUMPTABLE = (*cfl_get_predict_hbd_fn)(tx_size);
    (*UNRECOVERED_JUMPTABLE)
              ((xd->cfl).ac_buf_q3,(uint16_t *)((long)dst * 2),dst_stride,uVar17,xd->bd);
    return;
  }
  UNRECOVERED_JUMPTABLE_00 = (*cfl_get_predict_lbd_fn)(tx_size);
  (*UNRECOVERED_JUMPTABLE_00)((xd->cfl).ac_buf_q3,dst,dst_stride,uVar17);
  return;
}

Assistant:

void av1_cfl_predict_block(MACROBLOCKD *const xd, uint8_t *dst, int dst_stride,
                           TX_SIZE tx_size, int plane) {
  CFL_CTX *const cfl = &xd->cfl;
  MB_MODE_INFO *mbmi = xd->mi[0];
  assert(is_cfl_allowed(xd));

  if (!cfl->are_parameters_computed) cfl_compute_parameters(xd, tx_size);

  const int alpha_q3 =
      cfl_idx_to_alpha(mbmi->cfl_alpha_idx, mbmi->cfl_alpha_signs, plane - 1);
  assert((tx_size_high[tx_size] - 1) * CFL_BUF_LINE + tx_size_wide[tx_size] <=
         CFL_BUF_SQUARE);
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(xd)) {
    uint16_t *dst_16 = CONVERT_TO_SHORTPTR(dst);
    cfl_get_predict_hbd_fn(tx_size)(cfl->ac_buf_q3, dst_16, dst_stride,
                                    alpha_q3, xd->bd);
    return;
  }
#endif
  cfl_get_predict_lbd_fn(tx_size)(cfl->ac_buf_q3, dst, dst_stride, alpha_q3);
}